

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_homedir.c
# Opt level: O0

char * homedir(void)

{
  char *__s;
  __uid_t __uid;
  passwd *ppVar1;
  passwd *pw;
  char *home;
  
  home = GetEnv("CURL_HOME",'\0');
  if ((home == (char *)0x0) &&
     (pw = (passwd *)GetEnv("HOME",'\0'), home = (char *)pw, pw == (passwd *)0x0)) {
    __uid = geteuid();
    ppVar1 = getpwuid(__uid);
    if (ppVar1 != (passwd *)0x0) {
      __s = ppVar1->pw_dir;
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        pw = (passwd *)0x0;
      }
      else {
        pw = (passwd *)strdup(__s);
      }
    }
    home = (char *)pw;
  }
  return home;
}

Assistant:

char *homedir(void)
{
  char *home;

  home = GetEnv("CURL_HOME", FALSE);
  if(home)
    return home;

  home = GetEnv("HOME", FALSE);
  if(home)
    return home;

#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
 {
   struct passwd *pw = getpwuid(geteuid());

   if(pw) {
     home = pw->pw_dir;
     if(home && home[0])
       home = strdup(home);
     else
       home = NULL;
   }
 }
#endif /* PWD-stuff */
#ifdef WIN32
  home = GetEnv("APPDATA", TRUE);
  if(!home)
    home = GetEnv("%USERPROFILE%\\Application Data", TRUE); /* Normally only
                                                               on Win-2K/XP */
#endif /* WIN32 */
  return home;
}